

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O2

void test_val(float id,Am_Wrapper *result,Am_Wrapper *expected)

{
  char cVar1;
  ostream *poVar2;
  
  test_counter = test_counter + 1;
  if (suppress_successful == 0) {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,id);
    std::operator<<(poVar2,"     ");
  }
  else if (test_counter % 0x32 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Test ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,test_counter);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  cVar1 = (**(code **)(*(long *)result + 0x30))(result,expected);
  if (cVar1 == '\0') {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,id);
    poVar2 = std::operator<<(poVar2,"       expected ");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    poVar2 = std::operator<<(poVar2," result is ");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"*** TEST DID NOT SUCCEED. ***");
    std::endl<char,std::char_traits<char>>(poVar2);
    failed_tests = failed_tests + 1;
  }
  else if (suppress_successful == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"  result is ");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  Am_Wrapper::Release(result);
  Am_Wrapper::Release(expected);
  return;
}

Assistant:

void
test_val(float id, Am_Wrapper *result, Am_Wrapper *expected)
{
  ++test_counter;
  if (suppress_successful) {
    if ((test_counter % 50) == 0)
      cout << "Test " << test_counter << endl;
  } else
    cout << id << "     ";

  if (*result == *expected) {
    if (!suppress_successful)
      cout << "  result is " << result << endl;
  } else {
    cout << id << "       expected " << expected << " result is " << result
         << endl
         << "*** TEST DID NOT SUCCEED. ***" << endl;
    ++failed_tests;
  }
  result->Release();
  expected->Release();
}